

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON__UINT32 __thiscall
ON_XMLNodePrivate::DataCRC(ON_XMLNodePrivate *this,ON__UINT32 crc,bool recursive)

{
  ON__UINT32 OVar1;
  ON_wString *this_00;
  ON_XMLProperty *pOVar2;
  ON_XMLNode *pOVar3;
  ON_XMLNode *child;
  ChildIterator cit;
  ON_XMLProperty *prop;
  PropertyIterator pit;
  bool recursive_local;
  ON__UINT32 crc_local;
  ON_XMLNodePrivate *this_local;
  
  pit._private._3_1_ = recursive;
  pit._private._4_4_ = crc;
  this_00 = TagName(this);
  pit._private._4_4_ = ON_wString::DataCRCLower(this_00,pit._private._4_4_);
  (*this->m_node->_vptr_ON_XMLNode[0x2d])(&prop,this->m_node,0);
  while( true ) {
    pOVar2 = ON_XMLNode::PropertyIterator::GetNextProperty((PropertyIterator *)&prop);
    if (pOVar2 == (ON_XMLProperty *)0x0) break;
    pit._private._4_4_ = (*pOVar2->_vptr_ON_XMLProperty[4])(pOVar2,(ulong)pit._private._4_4_);
  }
  if ((pit._private._3_1_ & 1) != 0) {
    (*this->m_node->_vptr_ON_XMLNode[0x2c])(&child);
    while( true ) {
      pOVar3 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)&child);
      if (pOVar3 == (ON_XMLNode *)0x0) break;
      pit._private._4_4_ =
           DataCRC(pOVar3->_private,pit._private._4_4_,(bool)(pit._private._3_1_ & 1));
    }
    ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)&child);
  }
  OVar1 = pit._private._4_4_;
  ON_XMLNode::PropertyIterator::~PropertyIterator((PropertyIterator *)&prop);
  return OVar1;
}

Assistant:

ON__UINT32 ON_XMLNodePrivate::DataCRC(ON__UINT32 crc, bool recursive) const
{
  crc = TagName().DataCRCLower(crc);

  auto pit = m_node.GetPropertyIterator();
  ON_XMLProperty* prop = nullptr;
  while (nullptr != (prop = pit.GetNextProperty()))
  {
    crc = prop->DataCRC(crc);
  }

  if (recursive)
  {
    auto cit = m_node.GetChildIterator();
    ON_XMLNode* child = nullptr;
    while (nullptr != (child = cit.GetNextChild()))
    {
      crc = child->_private->DataCRC(crc, recursive);
    }
  }

  return crc;
}